

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_line_segments.h
# Opt level: O2

PrimInfo * __thiscall
embree::avx::LineSegmentsISA::createPrimRefArrayMB
          (PrimInfo *__return_storage_ptr__,LineSegmentsISA *this,PrimRef *prims,BBox1f *time_range,
          range<unsigned_long> *r,size_t k,uint geomID)

{
  float fVar1;
  BBox1f BVar2;
  uint uVar3;
  BufferView<embree::Vec3fx> *pBVar4;
  undefined1 auVar5 [16];
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar6;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar7;
  int iVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  int iVar11;
  ulong uVar12;
  ulong uVar13;
  size_t itime;
  int iVar14;
  ulong uVar15;
  size_t *psVar16;
  size_t sVar17;
  int iVar18;
  float fVar19;
  float fVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 extraout_var [56];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  float fVar26;
  float fVar27;
  float fVar29;
  undefined1 auVar28 [16];
  undefined1 auVar30 [16];
  float fVar32;
  float fVar33;
  float fVar34;
  undefined1 auVar31 [64];
  undefined1 auVar35 [64];
  float fVar37;
  float fVar38;
  undefined1 auVar36 [16];
  float fVar39;
  float fVar40;
  undefined1 auVar41 [64];
  undefined1 auVar42 [64];
  undefined1 auVar43 [64];
  float local_1d8;
  float fStack_1d4;
  float fStack_1d0;
  float fStack_1cc;
  undefined1 local_198 [16];
  undefined1 local_188 [16];
  ulong local_130;
  anon_class_16_2_4e716a3c local_128;
  BBox<embree::Vec3fa> bupper1;
  BBox<embree::Vec3fa> blower0;
  BBox<embree::Vec3fa> bi;
  BBox<embree::Vec3fa> bupper0;
  BBox<embree::Vec3fa> blower1;
  
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.field_0.
  m128[0] = INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.field_0.
  m128[1] = INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.field_0.
  m128[2] = INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.field_0.
  m128[3] = INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.field_0.
  m128[0] = -INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.field_0.
  m128[1] = -INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.field_0.
  m128[2] = -INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.field_0.
  m128[3] = -INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.field_0.
  m128[0] = INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.field_0.
  m128[1] = INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.field_0.
  m128[2] = INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.field_0.
  m128[3] = INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.field_0.
  m128[0] = -INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.field_0.
  m128[1] = -INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.field_0.
  m128[2] = -INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.field_0.
  m128[3] = -INFINITY;
  __return_storage_ptr__->begin = SUB168(ZEXT816(0) << 0x20,0);
  __return_storage_ptr__->end = SUB168(ZEXT816(0) << 0x20,8);
  auVar31._0_8_ = Geometry::getTimeRange((Geometry *)this);
  auVar31._8_56_ = extraout_var;
  auVar23._8_8_ = 0;
  auVar23._0_4_ = time_range->lower;
  auVar23._4_4_ = time_range->upper;
  auVar21 = auVar31._0_16_;
  auVar22 = vcmpps_avx(auVar21,auVar23,1);
  auVar5 = vblendps_avx(auVar23,auVar21,2);
  auVar21 = vinsertps_avx(auVar21,auVar23,0x50);
  auVar5 = vblendvps_avx(auVar21,auVar5,auVar22);
  auVar22 = vmovshdup_avx(auVar5);
  fVar40 = auVar22._0_4_;
  if (auVar5._0_4_ <= fVar40) {
    uVar13 = r->_begin;
    sVar17 = 0;
    auVar41 = ZEXT1664(ZEXT816(0) << 0x40);
    auVar42 = ZEXT1664(CONCAT412(0xddccb9a2,CONCAT48(0xddccb9a2,0xddccb9a2ddccb9a2)));
    auVar43 = ZEXT1664(CONCAT412(0x5dccb9a2,CONCAT48(0x5dccb9a2,0x5dccb9a25dccb9a2)));
    local_188._8_4_ = 0xff800000;
    local_188._0_8_ = 0xff800000ff800000;
    local_188._12_4_ = 0xff800000;
    auVar35 = ZEXT1664(local_188);
    local_198._8_4_ = 0x7f800000;
    local_198._0_8_ = 0x7f8000007f800000;
    local_198._12_4_ = 0x7f800000;
    auVar31 = ZEXT1664(local_198);
    while( true ) {
      if (r->_end <= uVar13) break;
      BVar2 = (this->super_LineSegments).super_Geometry.time_range;
      auVar22._8_8_ = 0;
      auVar22._0_4_ = BVar2.lower;
      auVar22._4_4_ = BVar2.upper;
      auVar22 = vmovshdup_avx(auVar22);
      fVar19 = BVar2.lower;
      fVar29 = auVar22._0_4_ - fVar19;
      uVar3 = *(uint *)(*(long *)&(this->super_LineSegments).super_Geometry.field_0x58 +
                       *(long *)&(this->super_LineSegments).field_0x68 * uVar13);
      uVar12 = (ulong)(uVar3 + 1);
      pBVar4 = (this->super_LineSegments).vertices.items;
      if (uVar12 < (pBVar4->super_RawBufferView).num) {
        fVar1 = (this->super_LineSegments).super_Geometry.fnumTimeSegments;
        auVar21 = ZEXT416((uint)(fVar1 * ((fVar40 - fVar19) / fVar29) * 0.99999976));
        auVar21 = vroundss_avx(auVar21,auVar21,10);
        auVar23 = vminss_avx(auVar21,ZEXT416((uint)fVar1));
        fVar26 = auVar5._0_4_ - fVar19;
        auVar21 = ZEXT416((uint)(fVar1 * (fVar26 / fVar29) * 1.0000002));
        auVar21 = vroundss_avx(auVar21,auVar21,9);
        auVar21 = vmaxss_avx(auVar41._0_16_,auVar21);
        psVar16 = &pBVar4[(int)auVar21._0_4_].super_RawBufferView.stride;
        uVar15 = (long)(int)auVar21._0_4_ - 1;
LAB_00bf1ac6:
        uVar15 = uVar15 + 1;
        if ((ulong)(long)(int)auVar23._0_4_ < uVar15) {
          fVar20 = auVar22._0_4_ - fVar19;
          fVar26 = fVar26 / fVar20;
          fVar20 = (fVar40 - fVar19) / fVar20;
          fVar29 = fVar1 * fVar26;
          fVar19 = fVar1 * fVar20;
          auVar23 = vroundss_avx(ZEXT416((uint)fVar29),ZEXT416((uint)fVar29),9);
          auVar24 = vroundss_avx(ZEXT416((uint)fVar19),ZEXT416((uint)fVar19),10);
          auVar22 = vmaxss_avx(auVar23,auVar41._0_16_);
          auVar21 = vminss_avx(auVar24,ZEXT416((uint)fVar1));
          iVar14 = (int)auVar22._0_4_;
          fVar27 = auVar21._0_4_;
          iVar11 = (int)auVar23._0_4_;
          iVar18 = -1;
          if (-1 < iVar11) {
            iVar18 = iVar11;
          }
          local_128.primID = &local_130;
          iVar8 = (int)fVar1 + 1;
          if ((int)auVar24._0_4_ < (int)fVar1 + 1) {
            iVar8 = (int)auVar24._0_4_;
          }
          local_130 = uVar13;
          local_128.this = &this->super_LineSegments;
          LineSegments::linearBounds::anon_class_16_2_4e716a3c::operator()
                    (&blower0,&local_128,(long)iVar14);
          LineSegments::linearBounds::anon_class_16_2_4e716a3c::operator()
                    (&bupper1,&local_128,(long)(int)fVar27);
          fVar29 = fVar29 - auVar22._0_4_;
          if (iVar8 - iVar18 == 1) {
            auVar22 = vmaxss_avx(ZEXT416((uint)fVar29),ZEXT816(0) << 0x40);
            auVar21 = vshufps_avx(auVar22,auVar22,0);
            auVar22 = ZEXT416((uint)(1.0 - auVar22._0_4_));
            auVar22 = vshufps_avx(auVar22,auVar22,0);
            auVar30._0_4_ =
                 auVar21._0_4_ * bupper1.lower.field_0.m128[0] +
                 auVar22._0_4_ * blower0.lower.field_0.m128[0];
            auVar30._4_4_ =
                 auVar21._4_4_ * bupper1.lower.field_0.m128[1] +
                 auVar22._4_4_ * blower0.lower.field_0.m128[1];
            auVar30._8_4_ =
                 auVar21._8_4_ * bupper1.lower.field_0.m128[2] +
                 auVar22._8_4_ * blower0.lower.field_0.m128[2];
            auVar30._12_4_ =
                 auVar21._12_4_ * bupper1.lower.field_0.m128[3] +
                 auVar22._12_4_ * blower0.lower.field_0.m128[3];
            auVar36._0_4_ =
                 auVar21._0_4_ * bupper1.upper.field_0.m128[0] +
                 auVar22._0_4_ * blower0.upper.field_0.m128[0];
            auVar36._4_4_ =
                 auVar21._4_4_ * bupper1.upper.field_0.m128[1] +
                 auVar22._4_4_ * blower0.upper.field_0.m128[1];
            auVar36._8_4_ =
                 auVar21._8_4_ * bupper1.upper.field_0.m128[2] +
                 auVar22._8_4_ * blower0.upper.field_0.m128[2];
            auVar36._12_4_ =
                 auVar21._12_4_ * bupper1.upper.field_0.m128[3] +
                 auVar22._12_4_ * blower0.upper.field_0.m128[3];
            auVar22 = vmaxss_avx(ZEXT416((uint)(fVar27 - fVar19)),ZEXT816(0) << 0x40);
            auVar21 = vshufps_avx(auVar22,auVar22,0);
            auVar22 = ZEXT416((uint)(1.0 - auVar22._0_4_));
            auVar22 = vshufps_avx(auVar22,auVar22,0);
            auVar24._0_4_ =
                 auVar22._0_4_ * bupper1.lower.field_0.m128[0] +
                 auVar21._0_4_ * blower0.lower.field_0.m128[0];
            auVar24._4_4_ =
                 auVar22._4_4_ * bupper1.lower.field_0.m128[1] +
                 auVar21._4_4_ * blower0.lower.field_0.m128[1];
            auVar24._8_4_ =
                 auVar22._8_4_ * bupper1.lower.field_0.m128[2] +
                 auVar21._8_4_ * blower0.lower.field_0.m128[2];
            auVar24._12_4_ =
                 auVar22._12_4_ * bupper1.lower.field_0.m128[3] +
                 auVar21._12_4_ * blower0.lower.field_0.m128[3];
            auVar28._0_4_ =
                 auVar22._0_4_ * bupper1.upper.field_0.m128[0] +
                 auVar21._0_4_ * blower0.upper.field_0.m128[0];
            auVar28._4_4_ =
                 auVar22._4_4_ * bupper1.upper.field_0.m128[1] +
                 auVar21._4_4_ * blower0.upper.field_0.m128[1];
            auVar28._8_4_ =
                 auVar22._8_4_ * bupper1.upper.field_0.m128[2] +
                 auVar21._8_4_ * blower0.upper.field_0.m128[2];
            auVar28._12_4_ =
                 auVar22._12_4_ * bupper1.upper.field_0.m128[3] +
                 auVar21._12_4_ * blower0.upper.field_0.m128[3];
          }
          else {
            LineSegments::linearBounds::anon_class_16_2_4e716a3c::operator()
                      (&blower1,&local_128,(long)(iVar14 + 1));
            LineSegments::linearBounds::anon_class_16_2_4e716a3c::operator()
                      (&bupper0,&local_128,(long)((int)fVar27 + -1));
            auVar22 = vmaxss_avx(ZEXT416((uint)fVar29),ZEXT816(0) << 0x40);
            auVar21 = vshufps_avx(auVar22,auVar22,0);
            auVar22 = ZEXT416((uint)(1.0 - auVar22._0_4_));
            auVar22 = vshufps_avx(auVar22,auVar22,0);
            auVar30._0_4_ =
                 auVar21._0_4_ * blower1.lower.field_0.m128[0] +
                 auVar22._0_4_ * blower0.lower.field_0.m128[0];
            auVar30._4_4_ =
                 auVar21._4_4_ * blower1.lower.field_0.m128[1] +
                 auVar22._4_4_ * blower0.lower.field_0.m128[1];
            auVar30._8_4_ =
                 auVar21._8_4_ * blower1.lower.field_0.m128[2] +
                 auVar22._8_4_ * blower0.lower.field_0.m128[2];
            auVar30._12_4_ =
                 auVar21._12_4_ * blower1.lower.field_0.m128[3] +
                 auVar22._12_4_ * blower0.lower.field_0.m128[3];
            auVar36._0_4_ =
                 auVar21._0_4_ * blower1.upper.field_0.m128[0] +
                 auVar22._0_4_ * blower0.upper.field_0.m128[0];
            auVar36._4_4_ =
                 auVar21._4_4_ * blower1.upper.field_0.m128[1] +
                 auVar22._4_4_ * blower0.upper.field_0.m128[1];
            auVar36._8_4_ =
                 auVar21._8_4_ * blower1.upper.field_0.m128[2] +
                 auVar22._8_4_ * blower0.upper.field_0.m128[2];
            auVar36._12_4_ =
                 auVar21._12_4_ * blower1.upper.field_0.m128[3] +
                 auVar22._12_4_ * blower0.upper.field_0.m128[3];
            auVar22 = vmaxss_avx(ZEXT416((uint)(fVar27 - fVar19)),ZEXT816(0) << 0x40);
            auVar21 = vshufps_avx(auVar22,auVar22,0);
            auVar22 = ZEXT416((uint)(1.0 - auVar22._0_4_));
            auVar22 = vshufps_avx(auVar22,auVar22,0);
            auVar24._0_4_ =
                 auVar21._0_4_ * bupper0.lower.field_0.m128[0] +
                 auVar22._0_4_ * bupper1.lower.field_0.m128[0];
            auVar24._4_4_ =
                 auVar21._4_4_ * bupper0.lower.field_0.m128[1] +
                 auVar22._4_4_ * bupper1.lower.field_0.m128[1];
            auVar24._8_4_ =
                 auVar21._8_4_ * bupper0.lower.field_0.m128[2] +
                 auVar22._8_4_ * bupper1.lower.field_0.m128[2];
            auVar24._12_4_ =
                 auVar21._12_4_ * bupper0.lower.field_0.m128[3] +
                 auVar22._12_4_ * bupper1.lower.field_0.m128[3];
            auVar28._0_4_ =
                 auVar21._0_4_ * bupper0.upper.field_0.m128[0] +
                 auVar22._0_4_ * bupper1.upper.field_0.m128[0];
            auVar28._4_4_ =
                 auVar21._4_4_ * bupper0.upper.field_0.m128[1] +
                 auVar22._4_4_ * bupper1.upper.field_0.m128[1];
            auVar28._8_4_ =
                 auVar21._8_4_ * bupper0.upper.field_0.m128[2] +
                 auVar22._8_4_ * bupper1.upper.field_0.m128[2];
            auVar28._12_4_ =
                 auVar21._12_4_ * bupper0.upper.field_0.m128[3] +
                 auVar22._12_4_ * bupper1.upper.field_0.m128[3];
            if (iVar11 < 0) {
              iVar11 = -1;
            }
            itime = (size_t)iVar11;
            while (itime = itime + 1, (long)itime < (long)iVar8) {
              auVar21._0_4_ = ((float)(int)itime / fVar1 - fVar26) / (fVar20 - fVar26);
              auVar21._4_12_ = SUB6012((undefined1  [60])0x0,0);
              auVar22 = vshufps_avx(auVar21,auVar21,0);
              local_1d8 = auVar24._0_4_;
              fStack_1d4 = auVar24._4_4_;
              fStack_1d0 = auVar24._8_4_;
              fStack_1cc = auVar24._12_4_;
              auVar21 = vshufps_avx(ZEXT416((uint)(1.0 - auVar21._0_4_)),
                                    ZEXT416((uint)(1.0 - auVar21._0_4_)),0);
              fVar32 = auVar30._4_4_;
              fVar33 = auVar30._8_4_;
              fVar34 = auVar30._12_4_;
              fVar29 = auVar28._4_4_;
              fVar19 = auVar28._8_4_;
              fVar27 = auVar28._12_4_;
              fVar37 = auVar36._4_4_;
              fVar38 = auVar36._8_4_;
              fVar39 = auVar36._12_4_;
              LineSegments::linearBounds::anon_class_16_2_4e716a3c::operator()(&bi,&local_128,itime)
              ;
              auVar10._4_4_ = auVar22._4_4_ * fStack_1d4 + fVar32 * auVar21._4_4_;
              auVar10._0_4_ = auVar22._0_4_ * local_1d8 + auVar30._0_4_ * auVar21._0_4_;
              auVar10._8_4_ = auVar22._8_4_ * fStack_1d0 + fVar33 * auVar21._8_4_;
              auVar10._12_4_ = auVar22._12_4_ * fStack_1cc + fVar34 * auVar21._12_4_;
              auVar23 = vsubps_avx((undefined1  [16])bi.lower.field_0,auVar10);
              auVar9._4_4_ = fVar29 * auVar22._4_4_ + fVar37 * auVar21._4_4_;
              auVar9._0_4_ = auVar28._0_4_ * auVar22._0_4_ + auVar36._0_4_ * auVar21._0_4_;
              auVar9._8_4_ = fVar19 * auVar22._8_4_ + fVar38 * auVar21._8_4_;
              auVar9._12_4_ = fVar27 * auVar22._12_4_ + fVar39 * auVar21._12_4_;
              auVar22 = vsubps_avx((undefined1  [16])bi.upper.field_0,auVar9);
              auVar21 = vminps_avx(auVar23,ZEXT816(0) << 0x40);
              auVar22 = vmaxps_avx(auVar22,ZEXT816(0) << 0x40);
              auVar30._0_4_ = auVar30._0_4_ + auVar21._0_4_;
              auVar30._4_4_ = fVar32 + auVar21._4_4_;
              auVar30._8_4_ = fVar33 + auVar21._8_4_;
              auVar30._12_4_ = fVar34 + auVar21._12_4_;
              auVar24._0_4_ = local_1d8 + auVar21._0_4_;
              auVar24._4_4_ = fStack_1d4 + auVar21._4_4_;
              auVar24._8_4_ = fStack_1d0 + auVar21._8_4_;
              auVar24._12_4_ = fStack_1cc + auVar21._12_4_;
              auVar36._0_4_ = auVar36._0_4_ + auVar22._0_4_;
              auVar36._4_4_ = fVar37 + auVar22._4_4_;
              auVar36._8_4_ = fVar38 + auVar22._8_4_;
              auVar36._12_4_ = fVar39 + auVar22._12_4_;
              auVar28._0_4_ = auVar28._0_4_ + auVar22._0_4_;
              auVar28._4_4_ = fVar29 + auVar22._4_4_;
              auVar28._8_4_ = fVar19 + auVar22._8_4_;
              auVar28._12_4_ = fVar27 + auVar22._12_4_;
            }
          }
          auVar41 = ZEXT1664(ZEXT816(0) << 0x40);
          auVar22 = vmaxps_avx(auVar36,auVar28);
          auVar21 = vminps_avx(auVar30,auVar24);
          aVar6 = (anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1)
                  vinsertps_avx(auVar21,ZEXT416(geomID),0x30);
          aVar7 = (anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1)
                  vinsertps_avx(auVar22,ZEXT416((uint)uVar13),0x30);
          local_198 = vminps_avx(local_198,(undefined1  [16])aVar6);
          local_188 = vmaxps_avx(local_188,(undefined1  [16])aVar7);
          auVar25._0_4_ = aVar6.x + aVar7.x;
          auVar25._4_4_ = aVar6.y + aVar7.y;
          auVar25._8_4_ = aVar6.z + aVar7.z;
          auVar25._12_4_ = aVar6.field_3.w + aVar7.field_3.w;
          auVar22 = vminps_avx((undefined1  [16])auVar31._0_16_,auVar25);
          auVar31 = ZEXT1664(auVar22);
          auVar22 = vmaxps_avx((undefined1  [16])auVar35._0_16_,auVar25);
          auVar35 = ZEXT1664(auVar22);
          sVar17 = sVar17 + 1;
          prims[k].lower.field_0.field_1 = aVar6;
          prims[k].upper.field_0.field_1 = aVar7;
          auVar42 = ZEXT1664(CONCAT412(0xddccb9a2,CONCAT48(0xddccb9a2,0xddccb9a2ddccb9a2)));
          auVar43 = ZEXT1664(CONCAT412(0x5dccb9a2,CONCAT48(0x5dccb9a2,0x5dccb9a25dccb9a2)));
          k = k + 1;
        }
        else {
          auVar21 = *(undefined1 (*) [16])
                     (((RawBufferView *)(psVar16 + -2))->ptr_ofs + *psVar16 * (ulong)uVar3);
          auVar24 = vcmpps_avx(auVar21,auVar42._0_16_,2);
          auVar28 = vcmpps_avx(auVar21,auVar43._0_16_,5);
          auVar24 = vorps_avx(auVar24,auVar28);
          if ((((auVar24 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
               (auVar24 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              (auVar24 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              -1 < auVar24[0xf]) {
            auVar24 = *(undefined1 (*) [16])
                       (((RawBufferView *)(psVar16 + -2))->ptr_ofs + *psVar16 * uVar12);
            auVar28 = vcmpps_avx(auVar24,auVar42._0_16_,2);
            auVar30 = vcmpps_avx(auVar24,auVar43._0_16_,5);
            auVar28 = vorps_avx(auVar28,auVar30);
            if ((((auVar28 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                 (auVar28 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                (auVar28 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                -1 < auVar28[0xf]) goto code_r0x00bf1b1a;
          }
        }
      }
LAB_00bf1dd3:
      uVar13 = uVar13 + 1;
    }
    *(undefined8 *)
     &(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.
      field_0 = local_198._0_8_;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.
             lower.field_0 + 8) = local_198._8_8_;
    *(undefined8 *)
     &(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.
      field_0 = local_188._0_8_;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.
             upper.field_0 + 8) = local_188._8_8_;
    (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.field_0
         = auVar31._0_16_;
    (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.field_0
         = auVar35._0_16_;
    __return_storage_ptr__->end = sVar17;
  }
  return __return_storage_ptr__;
code_r0x00bf1b1a:
  psVar16 = psVar16 + 7;
  auVar21 = vshufps_avx(auVar21,auVar21,0xff);
  auVar24 = vshufps_avx(auVar24,auVar24,0xff);
  auVar21 = vminss_avx(auVar21,auVar24);
  if (auVar21._0_4_ < 0.0) goto LAB_00bf1dd3;
  goto LAB_00bf1ac6;
}

Assistant:

PrimInfo createPrimRefArrayMB(PrimRef* prims, const BBox1f& time_range, const range<size_t>& r, size_t k, unsigned int geomID) const
      {
        PrimInfo pinfo(empty);
        const BBox1f t0t1 = BBox1f::intersect(getTimeRange(), time_range);
        if (t0t1.empty()) return pinfo;
        
        for (size_t j = r.begin(); j < r.end(); j++) {
          LBBox3fa lbounds = empty;
          if (!linearBounds(j, t0t1, lbounds))
            continue;
          const PrimRef prim(lbounds.bounds(), geomID, unsigned(j));
          pinfo.add_center2(prim);
          prims[k++] = prim;
        }
        return pinfo;
      }